

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

offset_datetime_format_info * __thiscall
toml::basic_value<toml::type_config>::as_offset_datetime_fmt(basic_value<toml::type_config> *this)

{
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ == offset_datetime) {
    return (offset_datetime_format_info *)((long)&this->field_1 + 0x10);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"toml::value::as_offset_datetime_fmt()",&local_31);
  throw_bad_cast(this,&local_30,offset_datetime);
}

Assistant:

offset_datetime_format_info const& as_offset_datetime_fmt() const
    {
        if(this->type_ != value_t::offset_datetime)
        {
            this->throw_bad_cast("toml::value::as_offset_datetime_fmt()", value_t::offset_datetime);
        }
        return this->offset_datetime_.format;
    }